

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O1

int VP8LResidualImage(int width,int height,int min_bits,int max_bits,int low_effort,uint32_t *argb,
                     uint32_t *argb_scratch,uint32_t *image,int near_lossless_quality,int exact,
                     int used_subtract_green,WebPPicture *pic,int percent_range,int *percent,
                     int *best_bits)

{
  int *piVar1;
  bool bVar2;
  byte bVar3;
  undefined1 auVar4 [16];
  uint32_t subsampling_index;
  int max_quantization;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  VP8LPredictorAddSubFunc *pp_Var11;
  uint8_t *max_diffs;
  uint32_t *puVar12;
  uint32_t *puVar13;
  ulong uVar14;
  int64_t iVar15;
  uint64_t uVar16;
  uint64_t uVar17;
  byte bVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  uint32_t *puVar26;
  int iVar27;
  uint uVar28;
  long lVar29;
  uint uVar30;
  int iVar31;
  uint uVar32;
  uint uVar33;
  long lVar34;
  uint32_t *puVar35;
  int iVar36;
  uint uVar37;
  long lVar38;
  int iVar39;
  uint32_t uVar40;
  uint32_t *puVar41;
  uint32_t *puVar42;
  ulong uVar43;
  uint uVar44;
  uint uVar45;
  ulong uVar46;
  int iVar47;
  uint uVar48;
  int iVar49;
  long lVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  uint local_a1c;
  ulong local_a18;
  uint32_t *local_a10;
  uint8_t *local_a08;
  uint8_t *tmp8;
  int local_9f0;
  long local_9d0;
  ulong local_9b8;
  int local_9ac;
  uint64_t local_920;
  uint32_t num_pixels [10];
  uint32_t *modes [10];
  uint32_t local_838 [514];
  
  auVar4 = _DAT_001b7770;
  uVar46 = (ulong)(uint)height;
  max_quantization =
       1 << (((char)(uint)((ulong)((long)near_lossless_quality * -0x66666667) >> 0x23) -
             (char)((long)near_lossless_quality * -0x66666667 >> 0x3f)) + 5U & 0x1f);
  iVar7 = *percent;
  if (low_effort == 0) {
    uVar21 = 0;
    lVar20 = (long)min_bits;
    if (min_bits <= max_bits) {
      puVar12 = num_pixels + lVar20;
      iVar5 = min_bits;
      do {
        bVar18 = (byte)iVar5;
        iVar39 = 1 << (bVar18 & 0x1f);
        uVar40 = ((uint)(iVar39 + height + -1) >> (bVar18 & 0x1f)) *
                 ((uint)(width + -1 + iVar39) >> (bVar18 & 0x1f));
        *puVar12 = uVar40;
        uVar6 = (int)uVar21 + uVar40;
        uVar21 = (ulong)uVar6;
        puVar12 = puVar12 + 1;
        iVar5 = iVar5 + 1;
      } while (max_bits + 1 != iVar5);
      uVar21 = (ulong)uVar6;
    }
    puVar12 = (uint32_t *)WebPSafeMalloc(uVar21,4);
    if (puVar12 != (uint32_t *)0x0) {
      modes[lVar20] = puVar12;
      uVar6 = max_bits - min_bits;
      if (uVar6 != 0 && min_bits <= max_bits) {
        puVar13 = modes[lVar20];
        lVar34 = lVar20;
        do {
          puVar13 = puVar13 + num_pixels[lVar34];
          modes[lVar34 + 1] = puVar13;
          lVar34 = lVar34 + 1;
        } while (max_bits != lVar34);
      }
      bVar18 = (byte)min_bits;
      uVar30 = 1 << (bVar18 & 0x1f);
      uVar44 = (uVar30 + height) - 1 >> (bVar18 & 0x1f);
      iVar27 = uVar6 + 1;
      puVar13 = (uint32_t *)WebPSafeCalloc((long)(iVar27 * 0x3c0e),4);
      iVar5 = *percent;
      iVar39 = 4;
      if (max_bits < 4) {
        iVar39 = max_bits;
      }
      iVar47 = min_bits;
      if (min_bits < iVar39) {
        iVar47 = iVar39;
      }
      *best_bits = 0;
      if (puVar13 == (uint32_t *)0x0) {
        local_a10 = (uint32_t *)0x0;
      }
      else {
        local_920 = 0x7fffffffffffffff;
        if (uVar44 != 0) {
          lVar34 = (long)width;
          uVar8 = (iVar47 - min_bits) + 1;
          uVar19 = 2;
          if (2 < uVar8) {
            uVar19 = uVar8;
          }
          uVar8 = ((uVar30 + width) - 1 >> (bVar18 & 0x1f)) - 1;
          uVar10 = 0;
          uVar33 = 0;
          uVar28 = 0;
          local_a1c = 0;
          iVar25 = 0;
          local_9ac = 0;
          do {
            iVar23 = local_a1c << (bVar18 & 0x1f);
            iVar31 = uVar28 << (bVar18 & 0x1f);
            uVar21 = (ulong)(uint)(height - iVar31);
            if ((int)uVar30 < height - iVar31) {
              uVar21 = (ulong)uVar30;
            }
            uVar48 = width - iVar23;
            uVar9 = (uint)(0 < (int)(local_a1c << (bVar18 & 0x1f)));
            uVar43 = (ulong)uVar48;
            if ((int)uVar30 < (int)uVar48) {
              uVar43 = (ulong)uVar30;
            }
            iVar49 = (int)uVar43;
            iVar36 = uVar9 + iVar49;
            lVar38 = (long)(int)(iVar23 - uVar9);
            local_9d0 = 0;
            puVar26 = argb_scratch;
            local_a10 = argb_scratch + lVar34 + 1;
            do {
              if (0 < iVar31) {
                memcpy(local_a10 + lVar38,argb + lVar38 + (iVar31 + -1) * width,(long)iVar36 * 4 + 4
                      );
              }
              local_9f0 = (int)uVar21;
              if (0 < local_9f0) {
                uVar22 = 0;
                do {
                  puVar41 = puVar26;
                  lVar29 = uVar22 + (long)iVar31;
                  bVar2 = lVar29 < (long)height + -1;
                  memcpy(puVar41 + lVar38,argb + lVar38 + lVar29 * lVar34,
                         (long)(int)(iVar36 + (uint)bVar2) << 2);
                  if (bVar2 && (0 < lVar29 && 1 < max_quantization)) {
                    MaxDiffsForRow((uint)((int)uVar30 < (int)uVar48) + iVar36,width,
                                   argb + lVar38 + lVar29 * lVar34,
                                   (uint8_t *)((long)(argb_scratch + lVar34 * 2 + 2) + lVar38),
                                   used_subtract_green);
                  }
                  GetResidual(width,height,local_a10,puVar41,
                              (uint8_t *)(argb_scratch + lVar34 * 2 + 2),(int)local_9d0,iVar23,
                              iVar49 + iVar23,(int)lVar29,max_quantization,exact,used_subtract_green
                              ,local_838);
                  if (0 < iVar49) {
                    uVar14 = 0;
                    do {
                      uVar9 = local_838[uVar14];
                      puVar13[local_9d0 * 0x400 + (ulong)(uVar9 >> 0x18)] =
                           puVar13[local_9d0 * 0x400 + (ulong)(uVar9 >> 0x18)] + 1;
                      piVar1 = (int *)((long)puVar13 +
                                      (ulong)(uVar9 >> 0xe & 0x3fc) + local_9d0 * 0x1000 + 0x400);
                      *piVar1 = *piVar1 + 1;
                      piVar1 = (int *)((long)puVar13 +
                                      (ulong)(uVar9 >> 6 & 0x3fc) + local_9d0 * 0x1000 + 0x800);
                      *piVar1 = *piVar1 + 1;
                      puVar13[local_9d0 * 0x400 + (ulong)(uVar9 & 0xff) + 0x300] =
                           puVar13[local_9d0 * 0x400 + (ulong)(uVar9 & 0xff) + 0x300] + 1;
                      uVar14 = uVar14 + 1;
                    } while (uVar43 != uVar14);
                  }
                  if (min_bits < iVar39) {
                    uVar9 = 1;
                    do {
                      if (0 < iVar49) {
                        iVar24 = uVar9 * 0xe + (int)local_9d0;
                        uVar14 = 0;
                        do {
                          uVar32 = local_838[uVar14];
                          puVar13[(long)(iVar24 * 0x400) + (ulong)(uVar32 >> 0x18)] =
                               puVar13[(long)(iVar24 * 0x400) + (ulong)(uVar32 >> 0x18)] + 1;
                          piVar1 = (int *)((long)puVar13 +
                                          (ulong)(uVar32 >> 0xe & 0x3fc) +
                                          (long)(iVar24 * 0x400) * 4 + 0x400);
                          *piVar1 = *piVar1 + 1;
                          piVar1 = (int *)((long)puVar13 +
                                          (ulong)(uVar32 >> 6 & 0x3fc) +
                                          (long)(iVar24 * 0x400) * 4 + 0x800);
                          *piVar1 = *piVar1 + 1;
                          puVar13[(long)(iVar24 * 0x400) + (ulong)(uVar32 & 0xff) + 0x300] =
                               puVar13[(long)(iVar24 * 0x400) + (ulong)(uVar32 & 0xff) + 0x300] + 1;
                          uVar14 = uVar14 + 1;
                        } while (uVar43 != uVar14);
                      }
                      uVar9 = uVar9 + 1;
                    } while (uVar9 != uVar19);
                  }
                  uVar22 = uVar22 + 1;
                  puVar26 = local_a10;
                  local_a10 = puVar41;
                } while (uVar22 != uVar21);
              }
              local_9d0 = local_9d0 + 1;
            } while (local_9d0 != 0xe);
            uVar9 = 0;
            do {
              bVar3 = (byte)uVar9;
              uVar32 = local_a1c >> (bVar3 & 0x1f);
              uVar48 = uVar28 >> (bVar3 & 0x1f);
              uVar37 = (uint)((1 << (bVar3 + bVar18 & 0x1f)) + width + -1) >>
                       (bVar3 + bVar18 & 0x1f);
              puVar26 = modes[lVar20 + (int)uVar9];
              local_9b8 = 0xff;
              local_a18 = 0xff;
              if (0 < (int)(local_a1c >> (bVar3 & 0x1f))) {
                local_a18 = (ulong)*(byte *)((long)puVar26 +
                                            (long)(int)(uVar37 * uVar48 + uVar32) * 4 + -3);
              }
              if (0 < (int)uVar48) {
                local_9b8 = (ulong)*(byte *)((long)puVar26 +
                                            (long)(int)((uVar48 - 1) * uVar37 + uVar32) * 4 + 1);
              }
              puVar41 = puVar13 + (int)(uVar9 * 0x3800);
              uVar21 = 0;
              lVar38 = 0x7fffffffffffffff;
              uVar45 = 0;
              puVar35 = puVar41;
              puVar42 = puVar13;
              do {
                lVar50 = 0;
                lVar29 = 0;
                do {
                  iVar15 = PredictionCostBias((uint32_t *)((long)puVar35 + lVar50),1,0x5e);
                  uVar16 = (*VP8LCombinedShannonEntropy)
                                     ((uint32_t *)((long)puVar35 + lVar50),
                                      (uint32_t *)
                                      (lVar50 + (long)(puVar13 +
                                                      (long)(iVar27 * 0x3800) +
                                                      (long)(int)(uVar9 << 10))));
                  lVar29 = uVar16 + iVar15 + lVar29;
                  lVar50 = lVar50 + 0x400;
                } while (lVar50 != 0x1000);
                lVar50 = lVar29 + -0x7800000;
                if (uVar21 != local_a18) {
                  lVar50 = lVar29;
                }
                lVar29 = lVar50 + -0x7800000;
                if (uVar21 != local_9b8) {
                  lVar29 = lVar50;
                }
                if (lVar29 < lVar38) {
                  lVar38 = lVar29;
                  puVar42 = puVar41 + uVar21 * 0x400;
                  uVar45 = (uint)uVar21;
                }
                uVar21 = uVar21 + 1;
                puVar35 = puVar35 + 0x400;
              } while (uVar21 != 0xe);
              (*VP8LAddVectorEq)(puVar42,puVar13 + (long)(iVar27 * 0x3800) +
                                                   (long)(int)(uVar9 << 10),0x400);
              puVar26[(int)(uVar37 * uVar48 + uVar32)] = uVar45 << 8 | 0xff000000;
              puVar13[(long)(iVar27 * 0x3800) +
                      (long)(iVar27 * 0x400) + (long)(int)(uVar9 * 0xe) + (ulong)uVar45] =
                   puVar13[(long)(iVar27 * 0x3800) +
                           (long)(iVar27 * 0x400) + (long)(int)(uVar9 * 0xe) + (ulong)uVar45] + 1;
              if (uVar9 == uVar6) {
                bVar2 = false;
              }
              else {
                uVar48 = uVar9 + 1;
                if (uVar48 <= uVar6 && (uint)(iVar47 - min_bits) < uVar48) {
                  (*VP8LAddVectorEq)(puVar41,puVar13 + (int)(uVar48 * 0x3800),0x3800);
                }
                if (((local_a1c == uVar8) ||
                    ((-1 << ((byte)uVar48 & 0x1f) | 0x7ffffffe - uVar10) == 0xffffffff)) &&
                   ((uVar28 == uVar44 - 1 ||
                    ((-1 << ((byte)uVar48 & 0x1f) | 0x7ffffffe - uVar33) == 0xffffffff)))) {
                  bVar2 = true;
                  uVar9 = uVar48;
                }
                else {
                  bVar2 = false;
                }
              }
            } while (bVar2);
            memset(puVar13,0,(ulong)(uVar9 * 0x3800 + 0x3800) << 2);
            if (uVar9 == uVar6) {
              local_9ac = local_9ac + 1;
              uVar33 = 0;
              if (local_a1c == uVar8) {
                local_9ac = 0;
              }
              iVar25 = iVar25 + (uint)(local_a1c == uVar8);
              uVar10 = 0;
            }
            else {
              bVar3 = (byte)uVar9;
              uVar10 = uVar10 >> (bVar3 & 0x1f);
              uVar33 = uVar33 >> (bVar3 & 0x1f);
              if ((local_a1c == uVar8) && ((uVar10 & 1) == 0)) {
                uVar33 = uVar33 + 1;
              }
              else if ((uVar10 & 1) == 0) {
                uVar10 = uVar10 | 1;
              }
              else {
                uVar33 = uVar33 + 1;
                uVar10 = uVar10 - 1;
              }
              uVar10 = uVar10 << (bVar3 & 0x1f);
              uVar33 = uVar33 << (bVar3 & 0x1f);
            }
            uVar28 = (iVar25 << ((byte)uVar6 & 0x1f)) + uVar33;
            local_a1c = (local_9ac << ((byte)uVar6 & 0x1f)) + uVar10;
            if ((local_a1c == 0) &&
               (iVar23 = WebPReportProgress(pic,(uVar28 * percent_range) / uVar44 + iVar5,percent),
               iVar23 == 0)) {
              WebPSafeFree(puVar13);
              local_a10 = (uint32_t *)0x0;
              goto LAB_0014c491;
            }
          } while (uVar28 < uVar44);
        }
        iVar5 = 0;
        local_a10 = (uint32_t *)0x0;
        uVar21 = 0;
        do {
          iVar39 = (int)uVar21;
          uVar16 = (*VP8LShannonEntropy)
                             (puVar13 + (long)(iVar27 * 0x3800) +
                                        (long)(iVar27 * 0x400) + (ulong)(uint)(iVar39 * 0xe),0xe);
          lVar34 = 0;
          do {
            uVar17 = (*VP8LShannonEntropy)
                               ((uint32_t *)
                                ((long)puVar13 +
                                lVar34 + (long)iVar5 * 4 + (long)(iVar27 * 0x3800) * 4),0x100);
            uVar16 = uVar16 + uVar17;
            lVar34 = lVar34 + 0x400;
          } while (lVar34 != 0x1000);
          if ((long)uVar16 < (long)local_920) {
            *best_bits = min_bits + iVar39;
            local_a10 = modes[lVar20 + uVar21];
            local_920 = uVar16;
          }
          uVar21 = (ulong)(iVar39 + 1U);
          iVar5 = iVar5 + 0x400;
        } while (iVar39 + 1U <= uVar6);
        WebPSafeFree(puVar13);
        VP8LOptimizeSampling(local_a10,width,height,*best_bits,9,best_bits);
      }
LAB_0014c491:
      if (*best_bits != 0) {
        bVar18 = (byte)*best_bits;
        iVar5 = 1 << (bVar18 & 0x1f);
        memcpy(image,local_a10,
               (ulong)(((uint)(iVar5 + height + -1) >> (bVar18 & 0x1f)) *
                      ((uint)(width + -1 + iVar5) >> (bVar18 & 0x1f))) << 2);
        WebPSafeFree(puVar12);
        goto LAB_0014b6c7;
      }
      WebPSafeFree(puVar12);
    }
    iVar7 = 0;
  }
  else {
    bVar18 = (byte)max_bits;
    iVar5 = 1 << (bVar18 & 0x1f);
    uVar6 = ((iVar5 + height) - 1U >> (bVar18 & 0x1f)) * ((width + iVar5) - 1U >> (bVar18 & 0x1f));
    if (0 < (int)uVar6) {
      lVar20 = (ulong)uVar6 - 1;
      auVar51._8_4_ = (int)lVar20;
      auVar51._0_8_ = lVar20;
      auVar51._12_4_ = (int)((ulong)lVar20 >> 0x20);
      uVar21 = 0;
      auVar51 = auVar51 ^ _DAT_001b7770;
      auVar52 = _DAT_001b8ce0;
      auVar53 = _DAT_001b6540;
      do {
        auVar54 = auVar53 ^ auVar4;
        iVar5 = auVar51._4_4_;
        if ((bool)(~(auVar54._4_4_ == iVar5 && auVar51._0_4_ < auVar54._0_4_ ||
                    iVar5 < auVar54._4_4_) & 1)) {
          image[uVar21] = 0xff000b00;
        }
        if ((auVar54._12_4_ != auVar51._12_4_ || auVar54._8_4_ <= auVar51._8_4_) &&
            auVar54._12_4_ <= auVar51._12_4_) {
          image[uVar21 + 1] = 0xff000b00;
        }
        auVar54 = auVar52 ^ auVar4;
        iVar39 = auVar54._4_4_;
        if (iVar39 <= iVar5 && (iVar39 != iVar5 || auVar54._0_4_ <= auVar51._0_4_)) {
          image[uVar21 + 2] = 0xff000b00;
          image[uVar21 + 3] = 0xff000b00;
        }
        uVar21 = uVar21 + 4;
        lVar20 = auVar53._8_8_;
        auVar53._0_8_ = auVar53._0_8_ + 4;
        auVar53._8_8_ = lVar20 + 4;
        lVar20 = auVar52._8_8_;
        auVar52._0_8_ = auVar52._0_8_ + 4;
        auVar52._8_8_ = lVar20 + 4;
      } while ((uVar6 + 3 & 0xfffffffc) != uVar21);
    }
    *best_bits = max_bits;
LAB_0014b6c7:
    bVar18 = (byte)*best_bits;
    iVar5 = 1 << (bVar18 & 0x1f);
    if (0 < height) {
      lVar20 = (long)width;
      tmp8 = (uint8_t *)(argb_scratch + lVar20 * 2 + 2);
      local_a08 = (uint8_t *)((long)argb_scratch + lVar20 * 9 + 8);
      uVar21 = 0;
      puVar12 = argb_scratch + lVar20 + 1;
      do {
        puVar26 = argb_scratch;
        puVar13 = argb + uVar21 * lVar20;
        uVar43 = uVar21 + 1;
        memcpy(puVar26,puVar13,(long)(int)(width + (uint)(uVar43 < uVar46)) << 2);
        if (low_effort == 0) {
          max_diffs = tmp8;
          if ((1 < max_quantization) &&
             (max_diffs = local_a08, local_a08 = tmp8, uVar21 + 2 < uVar46)) {
            MaxDiffsForRow(width,width,argb + uVar43 * lVar20,tmp8,used_subtract_green);
          }
          tmp8 = max_diffs;
          if (0 < width) {
            iVar39 = 0;
            do {
              iVar47 = iVar39 + iVar5;
              iVar27 = width;
              if (iVar47 < width) {
                iVar27 = iVar47;
              }
              GetResidual(width,height,puVar12,puVar26,max_diffs,
                          (uint)*(byte *)((long)image +
                                         (long)(int)((iVar39 >> (bVar18 & 0x1f)) +
                                                    ((uint)uVar21 >> (bVar18 & 0x1f)) *
                                                    ((iVar5 + width) - 1U >> (bVar18 & 0x1f))) * 4 +
                                         1),iVar39,iVar27,(uint)uVar21,max_quantization,exact,
                          used_subtract_green,puVar13 + iVar39);
              iVar39 = iVar27;
            } while (iVar47 < width);
          }
        }
        else {
          pp_Var11 = VP8LPredictorsSub + 2;
          puVar41 = puVar12;
          if (uVar21 == 0) {
            pp_Var11 = VP8LPredictorsSub;
            puVar41 = (uint32_t *)0x0;
          }
          (**pp_Var11)(puVar26,puVar41,1,puVar13);
          if (uVar21 == 0) {
            (*VP8LPredictorsSub[1])(puVar26 + 1,(uint32_t *)0x0,width + -1,puVar13 + 1);
          }
          else {
            (*VP8LPredictorsSub[0xb])(puVar26 + 1,puVar12 + 1,width + -1,puVar13 + 1);
          }
        }
        argb_scratch = puVar12;
        uVar21 = uVar43;
        puVar12 = puVar26;
      } while (uVar43 != uVar46);
    }
    iVar7 = WebPReportProgress(pic,iVar7 + percent_range,percent);
  }
  return iVar7;
}

Assistant:

int VP8LResidualImage(int width, int height, int min_bits, int max_bits,
                      int low_effort, uint32_t* const argb,
                      uint32_t* const argb_scratch, uint32_t* const image,
                      int near_lossless_quality, int exact,
                      int used_subtract_green, const WebPPicture* const pic,
                      int percent_range, int* const percent,
                      int* const best_bits) {
  int percent_start = *percent;
  const int max_quantization = 1 << VP8LNearLosslessBits(near_lossless_quality);
  if (low_effort) {
    const int tiles_per_row = VP8LSubSampleSize(width, max_bits);
    const int tiles_per_col = VP8LSubSampleSize(height, max_bits);
    int i;
    for (i = 0; i < tiles_per_row * tiles_per_col; ++i) {
      image[i] = ARGB_BLACK | (kPredLowEffort << 8);
    }
    *best_bits = max_bits;
  } else {
    // Allocate data to try all samplings from min_bits to max_bits.
    int bits;
    uint32_t sum_num_pixels = 0u;
    uint32_t *modes_raw, *best_mode;
    uint32_t* modes[MAX_TRANSFORM_BITS + 1];
    uint32_t num_pixels[MAX_TRANSFORM_BITS + 1];
    for (bits = min_bits; bits <= max_bits; ++bits) {
      const int tiles_per_row = VP8LSubSampleSize(width, bits);
      const int tiles_per_col = VP8LSubSampleSize(height, bits);
      num_pixels[bits] = tiles_per_row * tiles_per_col;
      sum_num_pixels += num_pixels[bits];
    }
    modes_raw = (uint32_t*)WebPSafeMalloc(sum_num_pixels, sizeof(*modes_raw));
    if (modes_raw == NULL) return 0;
    // Have modes point to the right global memory modes_raw.
    modes[min_bits] = modes_raw;
    for (bits = min_bits + 1; bits <= max_bits; ++bits) {
      modes[bits] = modes[bits - 1] + num_pixels[bits - 1];
    }
    // Find the best sampling.
    GetBestPredictorsAndSubSampling(
        width, height, min_bits, max_bits, argb_scratch, argb, max_quantization,
        exact, used_subtract_green, pic, percent_range, percent,
        &modes[min_bits], best_bits, &best_mode);
    if (*best_bits == 0) {
      WebPSafeFree(modes_raw);
      return 0;
    }
    // Keep the best predictor image.
    memcpy(image, best_mode,
           VP8LSubSampleSize(width, *best_bits) *
               VP8LSubSampleSize(height, *best_bits) * sizeof(*image));
    WebPSafeFree(modes_raw);
  }

  CopyImageWithPrediction(width, height, *best_bits, image, argb_scratch, argb,
                          low_effort, max_quantization, exact,
                          used_subtract_green);
  return WebPReportProgress(pic, percent_start + percent_range, percent);
}